

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall
ON_PlaneSurface::GetBBox(ON_PlaneSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ON_3dPoint *pOVar5;
  bool bVar6;
  long lVar7;
  ON_3dPoint local_b0;
  ON_3dPoint corner [4];
  
  lVar4 = 0;
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    pOVar5 = corner + (int)lVar7;
    lVar7 = (long)(int)lVar7 + 2;
    lVar3 = 0;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      ON_Surface::PointAt(&local_b0,&this->super_ON_Surface,
                          *(double *)(&this->field_0x90 + lVar4 * 8),
                          *(double *)(&this->field_0xa0 + lVar3 * 8));
      pOVar5->z = local_b0.z;
      pOVar5->x = local_b0.x;
      pOVar5->y = local_b0.y;
      pOVar5 = pOVar5 + 1;
      lVar3 = 1;
      bVar2 = false;
    } while (bVar6);
    lVar4 = 1;
    bVar2 = false;
  } while (bVar1);
  bVar2 = ON_GetPointListBoundingBox(3,false,4,3,&corner[0].x,boxmin,boxmax,(uint)bGrowBox);
  return bVar2;
}

Assistant:

bool ON_PlaneSurface::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  int i,j,k=0;
  ON_3dPoint corner[4];
  for ( i = 0; i < 2; i++ ) for ( j = 0; j < 2; j++ ) {
    corner[k++] = PointAt( m_domain[0].m_t[i], m_domain[1].m_t[j] );
  }
  return ON_GetPointListBoundingBox( 3, 0, 4, 3, 
                                     &corner[0].x, 
                                     boxmin, 
                                     boxmax, bGrowBox?true:false );
}